

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QItemViewPaintPair>::emplace<QItemViewPaintPair>
          (QMovableArrayOps<QItemViewPaintPair> *this,qsizetype i,QItemViewPaintPair *args)

{
  QItemViewPaintPair **ppQVar1;
  qsizetype *pqVar2;
  QModelIndex *pQVar3;
  Data *pDVar4;
  long lVar5;
  quintptr qVar6;
  qsizetype qVar7;
  QItemViewPaintPair *pQVar8;
  long in_FS_OFFSET;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  Inserter local_80;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  QAbstractItemModel *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
           super_QArrayDataPointer<QItemViewPaintPair>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>))
  goto LAB_004f29d0;
  if ((this->super_QGenericArrayOps<QItemViewPaintPair>).super_QArrayDataPointer<QItemViewPaintPair>
      .size == i) {
    qVar7 = QArrayDataPointer<QItemViewPaintPair>::freeSpaceAtEnd
                      ((QArrayDataPointer<QItemViewPaintPair> *)this);
    if (qVar7 == 0) goto LAB_004f29c7;
    pQVar8 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
             super_QArrayDataPointer<QItemViewPaintPair>.ptr;
    lVar5 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
            super_QArrayDataPointer<QItemViewPaintPair>.size;
    pQVar8[lVar5].index.m.ptr = (args->index).m.ptr;
    iVar10 = (args->rect).x1.m_i;
    iVar11 = (args->rect).y1.m_i;
    iVar12 = (args->rect).x2.m_i;
    iVar13 = (args->rect).y2.m_i;
    iVar14 = (args->index).c;
    qVar6 = (args->index).i;
    uVar16 = *(undefined4 *)((long)&(args->index).i + 4);
    pQVar3 = &pQVar8[lVar5].index;
    pQVar3->r = (args->index).r;
    pQVar3->c = iVar14;
    *(int *)&pQVar3->i = (int)qVar6;
    *(undefined4 *)((long)&pQVar3->i + 4) = uVar16;
    pQVar8 = pQVar8 + lVar5;
    (pQVar8->rect).x1.m_i = iVar10;
    (pQVar8->rect).y1.m_i = iVar11;
    (pQVar8->rect).x2.m_i = iVar12;
    (pQVar8->rect).y2.m_i = iVar13;
  }
  else {
LAB_004f29c7:
    if (i == 0) {
      qVar7 = QArrayDataPointer<QItemViewPaintPair>::freeSpaceAtBegin
                        ((QArrayDataPointer<QItemViewPaintPair> *)this);
      if (qVar7 == 0) goto LAB_004f29d0;
      pQVar8 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
               super_QArrayDataPointer<QItemViewPaintPair>.ptr;
      pQVar8[-1].index.m.ptr = (args->index).m.ptr;
      iVar10 = (args->rect).x1.m_i;
      iVar11 = (args->rect).y1.m_i;
      iVar12 = (args->rect).x2.m_i;
      iVar13 = (args->rect).y2.m_i;
      iVar14 = (args->index).r;
      iVar15 = (args->index).c;
      uVar16 = (undefined4)(args->index).i;
      uVar17 = *(undefined4 *)((long)&(args->index).i + 4);
    }
    else {
LAB_004f29d0:
      local_38 = (args->index).m.ptr;
      local_58._0_4_ = (args->rect).x1.m_i;
      local_58._4_4_ = (args->rect).y1.m_i;
      uStack_50._0_4_ = (args->rect).x2.m_i;
      uStack_50._4_4_ = (args->rect).y2.m_i;
      local_48._0_4_ = (args->index).r;
      local_48._4_4_ = (args->index).c;
      uStack_40 = (args->index).i;
      bVar9 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
              super_QArrayDataPointer<QItemViewPaintPair>.size != 0;
      QArrayDataPointer<QItemViewPaintPair>::detachAndGrow
                ((QArrayDataPointer<QItemViewPaintPair> *)this,(uint)(i == 0 && bVar9),1,
                 (QItemViewPaintPair **)0x0,(QArrayDataPointer<QItemViewPaintPair> *)0x0);
      if (i != 0 || !bVar9) {
        Inserter::Inserter(&local_80,(QArrayDataPointer<QItemViewPaintPair> *)this,i,1);
        ((local_80.displaceFrom)->index).m.ptr = local_38;
        ((local_80.displaceFrom)->index).r = (int)local_48;
        ((local_80.displaceFrom)->index).c = local_48._4_4_;
        *(undefined4 *)&((local_80.displaceFrom)->index).i = (undefined4)uStack_40;
        *(undefined4 *)((long)&((local_80.displaceFrom)->index).i + 4) = uStack_40._4_4_;
        ((local_80.displaceFrom)->rect).x1.m_i = (int)local_58;
        ((local_80.displaceFrom)->rect).y1.m_i = local_58._4_4_;
        ((local_80.displaceFrom)->rect).x2.m_i = (int)uStack_50;
        ((local_80.displaceFrom)->rect).y2.m_i = uStack_50._4_4_;
        (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
        goto LAB_004f2a80;
      }
      pQVar8 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
               super_QArrayDataPointer<QItemViewPaintPair>.ptr;
      pQVar8[-1].index.m.ptr = local_38;
      iVar10 = (int)local_58;
      iVar11 = local_58._4_4_;
      iVar12 = (int)uStack_50;
      iVar13 = uStack_50._4_4_;
      iVar14 = (int)local_48;
      iVar15 = local_48._4_4_;
      uVar16 = (undefined4)uStack_40;
      uVar17 = uStack_40._4_4_;
    }
    pQVar8[-1].index.r = iVar14;
    pQVar8[-1].index.c = iVar15;
    *(undefined4 *)&pQVar8[-1].index.i = uVar16;
    *(undefined4 *)((long)&pQVar8[-1].index.i + 4) = uVar17;
    pQVar8[-1].rect.x1.m_i = iVar10;
    pQVar8[-1].rect.y1.m_i = iVar11;
    pQVar8[-1].rect.x2.m_i = iVar12;
    pQVar8[-1].rect.y2.m_i = iVar13;
    ppQVar1 = &(this->super_QGenericArrayOps<QItemViewPaintPair>).
               super_QArrayDataPointer<QItemViewPaintPair>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
  }
  pqVar2 = &(this->super_QGenericArrayOps<QItemViewPaintPair>).
            super_QArrayDataPointer<QItemViewPaintPair>.size;
  *pqVar2 = *pqVar2 + 1;
LAB_004f2a80:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }